

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_fill_random
              (mbedtls_mpi *X,size_t size,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  long lVar2;
  uchar buf [1024];
  uchar local_418 [1032];
  
  iVar1 = -4;
  if (size < 0x401) {
    iVar1 = (*f_rng)(p_rng,local_418,size);
    if (iVar1 == 0) {
      iVar1 = mbedtls_mpi_read_binary(X,local_418,size);
    }
    lVar2 = 0;
    do {
      local_418[lVar2] = '\0';
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x400);
  }
  return iVar1;
}

Assistant:

int mbedtls_mpi_fill_random( mbedtls_mpi *X, size_t size,
                     int (*f_rng)(void *, unsigned char *, size_t),
                     void *p_rng )
{
    int ret;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];

    if( size > MBEDTLS_MPI_MAX_SIZE )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    MBEDTLS_MPI_CHK( f_rng( p_rng, buf, size ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary( X, buf, size ) );

cleanup:
    mbedtls_zeroize( buf, sizeof( buf ) );
    return( ret );
}